

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# do_wear.c
# Opt level: O0

void train_body_armor_skill(void)

{
  boolean bVar1;
  
  if (uarm != (obj *)0x0) {
    bVar1 = donning_on(uarm);
    if ((bVar1 == '\0') && ((uint)objects[0x77].oc_weight <= uarm->owt)) {
      train_skill_over_time
                (0x28,uarm->owt,&u.uarmortrain,16000,24000,(uint)objects[0x77].oc_weight,
                 (uint)objects[0x6a].oc_weight);
    }
  }
  return;
}

Assistant:

void train_body_armor_skill(void)
{
    if (uarm && !donning_on(uarm) && uarm->owt >= P_BODY_ARMOR_MIN_WEIGHT) {
	train_skill_over_time(
		P_BODY_ARMOR,
		uarm->owt,
		&u.uarmortrain,
		16000,
		24000,
		P_BODY_ARMOR_MIN_WEIGHT,
		objects[PLATE_MAIL].oc_weight);
    }
}